

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O1

LY_ERR yin_parse_deviation(lysp_yin_ctx *ctx,lysp_deviation **deviations)

{
  long lVar1;
  LY_ERR LVar2;
  long *plVar3;
  lysp_ext_instance *plVar4;
  ly_ctx *ctx_00;
  lysp_deviation *plVar5;
  lysf_ctx fctx;
  yin_subelement subelems [4];
  lysf_ctx local_b8;
  yin_subelement local_98;
  undefined4 local_80;
  long *local_78;
  undefined2 local_70;
  undefined4 local_68;
  long *local_60;
  undefined2 local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  
  local_b8.ext_set.size = 0;
  local_b8.ext_set.count = 0;
  local_b8.ext_set.field_2.dnodes = (lyd_node **)0x0;
  local_b8.mod = (lys_module *)0x0;
  if (ctx == (lysp_yin_ctx *)0x0) {
    local_b8.ctx = (ly_ctx *)0x0;
  }
  else {
    local_b8.ctx = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
  }
  plVar5 = *deviations;
  if (plVar5 == (lysp_deviation *)0x0) {
    plVar3 = (long *)malloc(0x30);
    if (plVar3 != (long *)0x0) {
      *plVar3 = 1;
      goto LAB_001886d4;
    }
  }
  else {
    plVar4 = plVar5[-1].exts;
    plVar5[-1].exts = (lysp_ext_instance *)((long)&plVar4->name + 1);
    plVar3 = (long *)realloc(&plVar5[-1].exts,(long)plVar4 * 0x28 + 0x30);
    if (plVar3 != (long *)0x0) {
LAB_001886d4:
      *deviations = (lysp_deviation *)(plVar3 + 1);
      lVar1 = *plVar3;
      plVar5 = (lysp_deviation *)(plVar3 + lVar1 * 5 + -4);
      plVar5->ref = (char *)0x0;
      plVar5->deviates = (lysp_deviate *)0x0;
      plVar5->nodeid = (char *)0x0;
      plVar5->dsc = (char *)0x0;
      plVar5->exts = (lysp_ext_instance *)0x0;
      LVar2 = lyxml_ctx_next(ctx->xmlctx);
      if ((LVar2 == LY_SUCCESS) &&
         (LVar2 = yin_parse_attribute(ctx,YIN_ARG_TARGET_NODE,(char **)plVar5,Y_STR_ARG,
                                      LY_STMT_DEVIATION), LVar2 == LY_SUCCESS)) {
        if (*plVar5->nodeid == '\0') {
          if (ctx == (lysp_yin_ctx *)0x0) {
            ctx_00 = (ly_ctx *)0x0;
          }
          else {
            ctx_00 = (ly_ctx *)
                     **(undefined8 **)
                       (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          ly_log(ctx_00,LY_LLWRN,LY_SUCCESS,"Empty argument of %s statement does not make sense.",
                 "deviation");
        }
        local_98.type = LY_STMT_DESCRIPTION;
        local_98.dest = plVar3 + lVar1 * 5 + -3;
        local_98.flags = 2;
        local_80 = 0x90000;
        local_78 = plVar3 + lVar1 * 5 + -1;
        local_70 = 1;
        local_68 = 0x270000;
        local_60 = plVar3 + lVar1 * 5 + -2;
        local_58 = 2;
        uStack_48 = 0;
        local_40 = 0;
        local_50 = 0xf0000;
        LVar2 = yin_parse_content(ctx,&local_98,4,plVar5,LY_STMT_DEVIATION,(char **)0x0,
                                  (lysp_ext_instance **)(plVar3 + lVar1 * 5));
        if ((LVar2 == LY_SUCCESS) &&
           (plVar4 = (lysp_ext_instance *)plVar3[lVar1 * 5], LVar2 = LY_SUCCESS,
           plVar4 != (lysp_ext_instance *)0x0)) {
          LVar2 = ly_set_add(&ctx->main_ctx->ext_inst,plVar4,'\x01',(uint32_t *)0x0);
        }
      }
      if (LVar2 == LY_SUCCESS) {
        return LY_SUCCESS;
      }
      lysp_deviation_free(&local_b8,plVar5);
      plVar5 = *deviations;
      plVar4 = (lysp_ext_instance *)((long)&plVar5[-1].exts[-1].exts + 7);
      plVar5[-1].exts = plVar4;
      if (plVar4 != (lysp_ext_instance *)0x0 && plVar5 != (lysp_deviation *)0x0) {
        return LVar2;
      }
      if (plVar5 != (lysp_deviation *)0x0) {
        free(&plVar5[-1].exts);
      }
      *deviations = (lysp_deviation *)0x0;
      return LVar2;
    }
    (*deviations)[-1].exts = (lysp_ext_instance *)((long)&(*deviations)[-1].exts[-1].exts + 7);
  }
  ly_log(ctx->xmlctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","yin_parse_deviation")
  ;
  return LY_EMEM;
}

Assistant:

static LY_ERR
yin_parse_deviation(struct lysp_yin_ctx *ctx, struct lysp_deviation **deviations)
{
    LY_ERR ret = LY_SUCCESS;
    struct lysp_deviation *dev = NULL;
    struct lysf_ctx fctx = {.ctx = PARSER_CTX(ctx)};

    /* create new deviation */
    LY_ARRAY_NEW_RET(ctx->xmlctx->ctx, *deviations, dev, LY_EMEM);

    /* parse argument */
    LY_CHECK_GOTO(ret = lyxml_ctx_next(ctx->xmlctx), cleanup);
    LY_CHECK_GOTO(ret = yin_parse_attribute(ctx, YIN_ARG_TARGET_NODE, &dev->nodeid, Y_STR_ARG, LY_STMT_DEVIATION), cleanup);
    CHECK_NONEMPTY((struct lysp_ctx *)ctx, strlen(dev->nodeid), "deviation");
    struct yin_subelement subelems[] = {
        {LY_STMT_DESCRIPTION, &dev->dsc, YIN_SUBELEM_UNIQUE},
        {LY_STMT_DEVIATE, &dev->deviates, YIN_SUBELEM_MANDATORY},
        {LY_STMT_REFERENCE, &dev->ref, YIN_SUBELEM_UNIQUE},
        {LY_STMT_EXTENSION_INSTANCE, NULL, 0},
    };

    ret = yin_parse_content(ctx, subelems, ly_sizeofarray(subelems), dev, LY_STMT_DEVIATION, NULL, &dev->exts);
    LY_CHECK_GOTO(ret, cleanup);

    /* store extension instance array (no realloc anymore) to find the plugin records and finish parsing */
    LY_CHECK_GOTO(ret = yin_unres_exts_add(ctx, dev->exts), cleanup);

cleanup:
    if (ret) {
        lysp_deviation_free(&fctx, dev);
        LY_ARRAY_DECREMENT_FREE(*deviations);
    }
    return ret;
}